

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

void Zyx_PrintClause(int *pLits,int nLits)

{
  uint uVar1;
  ulong uVar2;
  
  if (0 < nLits) {
    uVar2 = 0;
    do {
      uVar1 = pLits[uVar2];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      printf("%c%d ",(ulong)((uVar1 & 1) * 2 + 0x2b),(ulong)(uVar1 >> 1));
      uVar2 = uVar2 + 1;
    } while ((uint)nLits != uVar2);
  }
  putchar(10);
  return;
}

Assistant:

void Zyx_PrintClause( int * pLits, int nLits )
{
    int i;
    for ( i = 0; i < nLits; i++ )
        printf( "%c%d ", Abc_LitIsCompl(pLits[i]) ? '-' : '+', Abc_Lit2Var(pLits[i]) );
    printf( "\n" );
}